

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndPopup(void)

{
  uint uVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *g;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  uVar1 = pIVar2->Flags;
  if ((uVar1 >> 0x1a & 1) == 0) {
    __assert_fail("window->Flags & ImGuiWindowFlags_Popup",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1e90,"void ImGui::EndPopup()");
  }
  if (0 < (GImGui->BeginPopupStack).Size) {
    if (GImGui->NavWindow == pIVar2) {
      GImGui->NavWrapRequestWindow = pIVar2;
      pIVar3->NavWrapRequestFlags = 2;
    }
    if (pIVar3->WithinEndChild == false) {
      if ((uVar1 >> 0x18 & 1) != 0) {
        pIVar3->WithinEndChild = true;
      }
      End();
      pIVar3->WithinEndChild = false;
      return;
    }
    __assert_fail("g.WithinEndChild == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x1e98,"void ImGui::EndPopup()");
  }
  __assert_fail("g.BeginPopupStack.Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x1e91,"void ImGui::EndPopup()");
}

Assistant:

void ImGui::EndPopup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(window->Flags & ImGuiWindowFlags_Popup);  // Mismatched BeginPopup()/EndPopup() calls
    IM_ASSERT(g.BeginPopupStack.Size > 0);

    // Make all menus and popups wrap around for now, may need to expose that policy.
    if (g.NavWindow == window)
        NavMoveRequestTryWrapping(window, ImGuiNavMoveFlags_LoopY);

    // Child-popups don't need to be laid out
    IM_ASSERT(g.WithinEndChild == false);
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        g.WithinEndChild = true;
    End();
    g.WithinEndChild = false;
}